

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Sandbox.cpp
# Opt level: O0

void __thiscall Sandbox::error(Sandbox *this,AccessType type,u32 addr,u64 cycle,u32 fc,u16 value)

{
  long lVar1;
  uint local_2c;
  int i;
  u16 value_local;
  u32 fc_local;
  u64 cycle_local;
  u32 addr_local;
  AccessType type_local;
  Sandbox *this_local;
  
  lVar1 = this->errors;
  this->errors = lVar1 + 1;
  if (lVar1 == 0) {
    printf("\nACCESS %d DOESN\'T MATCH:\n",(ulong)(uint)this->replayCnt);
    printf("i: %2d  ",(ulong)(uint)this->replayCnt);
    printf("Type: %s  ",accessTypeStr[type]);
    printf("Addr: %4x  ",(ulong)addr);
    printf("Cycle: %3lu  ",cycle);
    printf("FC: %d  ",(ulong)fc);
    if ((type == POKE8) || (type == POKE16)) {
      printf("Value: %4x  ",(ulong)value);
    }
    printf("\n\n");
    printf("ACCESS RECORD:\n");
    for (local_2c = 0; (int)local_2c < this->recordCnt; local_2c = local_2c + 1) {
      printf("i: %2d  ",(ulong)local_2c);
      printf("Type: %s  ",accessTypeStr[this->access[(int)local_2c].type]);
      printf("Addr: %4x  ",(ulong)this->access[(int)local_2c].addr);
      printf("Cycle: %3lu  ",this->access[(int)local_2c].cycle);
      printf("FC: %d  ",(ulong)this->access[(int)local_2c].fc);
      printf("Value: %4x  ",(ulong)this->access[(int)local_2c].value);
      printf("\n");
    }
  }
  return;
}

Assistant:

void
Sandbox::error(AccessType type, u32 addr, u64 cycle, u32 fc, u16 value)
{
    if (errors++ == 0) {

        printf("\nACCESS %d DOESN'T MATCH:\n", replayCnt);
        printf("i: %2d  ", replayCnt);
        printf("Type: %s  ", accessTypeStr[type]);
        printf("Addr: %4x  ", addr);
        printf("Cycle: %3lu  ", (long)cycle);
        printf("FC: %d  ", fc);
        if (type == POKE8 || type == POKE16) printf("Value: %4x  ", value);
        printf("\n\n");

        printf("ACCESS RECORD:\n");
        for (int i = 0; i < recordCnt; i++) {
            printf("i: %2d  ", i);
            printf("Type: %s  ", accessTypeStr[access[i].type]);
            printf("Addr: %4x  ", access[i].addr);
            printf("Cycle: %3lu  ", (long)access[i].cycle);
            printf("FC: %d  ", access[i].fc);
            printf("Value: %4x  ", access[i].value);
            printf("\n");
        }
    }
}